

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

void __thiscall mat_lib::vector<double>::save_as(vector<double> *this,string *file_name)

{
  code *pcVar1;
  ostream *poVar2;
  logic_error *this_00;
  ofstream ofs;
  ostringstream str_stream;
  string asStack_3b8 [32];
  long local_398;
  filebuf local_390 [24];
  byte abStack_378 [216];
  ios_base local_2a0 [264];
  ostringstream local_198 [376];
  
  std::ofstream::ofstream(&local_398,(string *)file_name,_S_out);
  if ((abStack_378[*(long *)(local_398 + -0x18)] & 5) == 0) {
    if (this->format__ == fixed) {
      pcVar1 = std::fixed;
    }
    else {
      pcVar1 = std::scientific;
    }
    (*pcVar1)(local_390 + *(long *)(local_398 + -0x18) + -8);
    *(long *)(local_390 + *(long *)(local_398 + -0x18)) = (long)this->fractional_digits__;
    operator<<((ostream *)&local_398,this);
    local_398 = _VTT;
    *(undefined8 *)(local_390 + *(long *)(_VTT + -0x18) + -8) = _strtod;
    std::filebuf::~filebuf(local_390);
    std::ios_base::~ios_base(local_2a0);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"cannot open file \"",0x12);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(file_name->_M_dataplus)._M_p,file_name->_M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"! (",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"save_as",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"() in ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
             ,0x5b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x397);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::logic_error::logic_error(this_00,asStack_3b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void vector<T>::save_as(const string &file_name) const {
        ofstream ofs(file_name);
        if(!ofs)
        {
            ostringstream str_stream;
            str_stream<<"cannot open file \""<<file_name<<"\"! ("
                      <<__func__<<"() in "<<__FILE__<<":"<<__LINE__<<")";
            throw logic_error(str_stream.str());
        }

        auto formatter = format__ == mat_lib::fixed ? std::fixed : std::scientific;
        ofs << formatter << setprecision(fractional_digits__) << *this;
    }